

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

word Dau_Dsd6TruthCompose_rec(word Func,word *pFanins,int nVars)

{
  int iVar1;
  ulong uVar2;
  word wVar3;
  word wVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  
  uVar6 = (ulong)(nVars - 1);
  lVar8 = 0;
  do {
    uVar9 = nVars;
    lVar7 = lVar8;
    if (Func + 1 < 2) {
      return Func;
    }
    if ((int)uVar9 < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x155,"word Dau_Dsd6TruthCompose_rec(word, word *, int)");
    }
    iVar1 = (int)(uVar6 + lVar7);
    if (iVar1 == 0) {
      if (Func == 0x5555555555555555 || s_Truths6[0] == Func) {
        return -(ulong)(s_Truths6[0] != Func) ^ *pFanins;
      }
      __assert_fail("Func == s_Truths6[0] || Func == s_Truths6Neg[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x158,"word Dau_Dsd6TruthCompose_rec(word, word *, int)");
    }
    bVar5 = (byte)(1 << ((byte)(uVar6 + lVar7) & 0x1f));
    lVar8 = lVar7 + -1;
    nVars = uVar9 - 1;
  } while ((s_Truths6Neg[iVar1] & (Func >> (bVar5 & 0x3f) ^ Func)) == 0);
  if (uVar9 < 7) {
    uVar2 = *(ulong *)(uVar6 * 8 + 0x887718 + lVar8 * 8) & Func;
    wVar3 = Dau_Dsd6TruthCompose_rec(uVar2 << (bVar5 & 0x3f) | uVar2,pFanins,nVars);
    uVar2 = Func & *(ulong *)(uVar6 * 8 + 0xac3508 + lVar8 * 8);
    wVar4 = Dau_Dsd6TruthCompose_rec(uVar2 >> (bVar5 & 0x3f) | uVar2,pFanins,nVars);
    return (wVar4 ^ wVar3) & pFanins[uVar6 + lVar7] ^ wVar3;
  }
  __assert_fail("iVar >= 0 && iVar < 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                ,0x1bb,"word Abc_Tt6Cofactor0(word, int)");
}

Assistant:

word Dau_Dsd6TruthCompose_rec( word Func, word * pFanins, int nVars )
{
    word t0, t1;
    if ( Func == 0 )
        return 0;
    if ( Func == ~(word)0 )
        return ~(word)0;
    assert( nVars > 0 );
    if ( --nVars == 0 )
    {
        assert( Func == s_Truths6[0] || Func == s_Truths6Neg[0] );
        return (Func == s_Truths6[0]) ? pFanins[0] : ~pFanins[0];
    }
    if ( !Abc_Tt6HasVar(Func, nVars) )
        return Dau_Dsd6TruthCompose_rec( Func, pFanins, nVars );
    t0 = Dau_Dsd6TruthCompose_rec( Abc_Tt6Cofactor0(Func, nVars), pFanins, nVars );
    t1 = Dau_Dsd6TruthCompose_rec( Abc_Tt6Cofactor1(Func, nVars), pFanins, nVars );
    return (~pFanins[nVars] & t0) | (pFanins[nVars] & t1);
}